

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

void mxx::scatterv<int>(int *msgs,vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,
                       int *out,size_t recv_size,int root,comm *comm)

{
  undefined4 uVar1;
  size_t sVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  int iVar4;
  size_type sVar5;
  const_iterator cVar6;
  const_iterator __last;
  iterator __result;
  reference pvVar7;
  reference pvVar8;
  MPI_Datatype poVar9;
  MPI_Datatype poVar10;
  MPI_Comm poVar11;
  undefined1 local_e0 [8];
  vector<int,_std::allocator<int>_> displs;
  allocator<int> local_91;
  undefined1 local_90 [8];
  vector<int,_std::allocator<int>_> send_counts;
  undefined1 local_70 [4];
  int irecv_size;
  datatype dt;
  ulong local_48;
  size_t send_size;
  comm *comm_local;
  size_t sStack_30;
  int root_local;
  size_t recv_size_local;
  int *out_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes_local;
  int *msgs_local;
  
  send_size = (size_t)comm;
  comm_local._4_4_ = root;
  sStack_30 = recv_size;
  recv_size_local = (size_t)out;
  out_local = (int *)sizes;
  sizes_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)msgs;
  iVar4 = mxx::comm::rank(comm);
  if (root == iVar4) {
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local);
    iVar4 = mxx::comm::size((comm *)send_size);
    if (sVar5 != (long)iVar4) {
      assert_fail("root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                  ,0x142,"scatterv");
    }
  }
  cVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local);
  dt._16_8_ = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local);
  local_48 = std::
             accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                       ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         )cVar6._M_current,
                        (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         )dt._16_8_,0);
  bcast<unsigned_long>(&local_48,comm_local._4_4_,(comm *)send_size);
  if (local_48 < 0x7fffffff) {
    get_datatype<int>();
    send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = (undefined4)sStack_30;
    iVar4 = mxx::comm::rank((comm *)send_size);
    sVar2 = recv_size_local;
    uVar1 = send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    if (iVar4 == comm_local._4_4_) {
      iVar4 = mxx::comm::size((comm *)send_size);
      std::allocator<int>::allocator(&local_91);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_90,(long)iVar4,&local_91);
      std::allocator<int>::~allocator(&local_91);
      cVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local);
      __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local);
      __result = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_90);
      displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )cVar6._M_current,
                               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )__last._M_current,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                               __result._M_current);
      impl::get_displacements<int>
                ((vector<int,_std::allocator<int>_> *)local_e0,
                 (vector<int,_std::allocator<int>_> *)local_90);
      pvVar3 = sizes_local;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_90,0);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_e0,0);
      poVar9 = datatype::type((datatype *)local_70);
      sVar2 = recv_size_local;
      uVar1 = send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      poVar10 = datatype::type((datatype *)local_70);
      iVar4 = comm_local._4_4_;
      poVar11 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)send_size);
      MPI_Scatterv(pvVar3,pvVar7,pvVar8,poVar9,sVar2,uVar1,poVar10,iVar4,poVar11);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e0)
      ;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90)
      ;
    }
    else {
      poVar9 = datatype::type((datatype *)local_70);
      iVar4 = comm_local._4_4_;
      poVar11 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)send_size);
      MPI_Scatterv(0,0,0,&ompi_mpi_datatype_null,sVar2,uVar1,poVar9,iVar4,poVar11);
    }
    datatype::~datatype((datatype *)local_70);
  }
  else {
    impl::scatterv_big<int>
              ((int *)sizes_local,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local
               ,(int *)recv_size_local,sStack_30,comm_local._4_4_,(comm *)send_size);
  }
  return;
}

Assistant:

void scatterv(const T* msgs, const std::vector<size_t>& sizes, T* out, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size()));
    // get total send size
    size_t send_size = std::accumulate(sizes.begin(), sizes.end(), static_cast<size_t>(0));
    mxx::bcast(send_size, root, comm);
    // check if we need to use the custom BIG scatterv
    if (send_size >= mxx::max_int) {
        // own scatter for large messages
        impl::scatterv_big(msgs, sizes, out, recv_size, root, comm);
    } else {
        // regular implementation using integer counts
        mxx::datatype dt = mxx::get_datatype<T>();
        int irecv_size = recv_size;
        if (comm.rank() == root) {
            std::vector<int> send_counts(comm.size());
            std::copy(sizes.begin(), sizes.end(), send_counts.begin());
            std::vector<int> displs = impl::get_displacements(send_counts);
            MPI_Scatterv(const_cast<T*>(msgs), &send_counts[0], &displs[0], dt.type(),
                         out, irecv_size, dt.type(), root, comm);
        } else {
            MPI_Scatterv(NULL, NULL, NULL, MPI_DATATYPE_NULL,
                         out, irecv_size, dt.type(), root, comm);
        }
    }
}